

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O2

void __thiscall
Rml::ElementInstancerText::ReleaseElement(ElementInstancerText *this,Element *element)

{
  ElementInstancerPools *pEVar1;
  ElementText *object;
  
  pEVar1 = ControlledLifetimeResource<Rml::ElementInstancerPools>::operator->
                     ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)
                      element_instancer_pools);
  object = rmlui_static_cast<Rml::ElementText*,Rml::Element*>(element);
  Pool<Rml::ElementText>::DestroyAndDeallocate(&pEVar1->pool_text_default,object);
  return;
}

Assistant:

void ElementInstancerText::ReleaseElement(Element* element)
{
	element_instancer_pools->pool_text_default.DestroyAndDeallocate(rmlui_static_cast<ElementText*>(element));
}